

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<GraphContigger> * __thiscall
pybind11::class_<GraphContigger>::
def<void(GraphContigger::*)(PairedReadsDatastore_const&,int,int,int,float),pybind11::arg,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v>
          (class_<GraphContigger> *this,char *name_,offset_in_Node_to_subr *f,arg *extra,
          arg_v *extra_1,arg_v *extra_2,arg_v *extra_3,arg_v *extra_4)

{
  handle obj;
  object *in_RCX;
  undefined8 *in_RDX;
  PyObject *extraout_RDX;
  char *in_RSI;
  handle *in_RDI;
  char *in_R8;
  arg_v *in_R9;
  cpp_function cf;
  handle *in_stack_ffffffffffffff18;
  sibling *in_stack_ffffffffffffff20;
  none *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  handle default_;
  name *in_stack_ffffffffffffff70;
  offset_in_Node_to_subr in_stack_ffffffffffffff78;
  cpp_function *local_80;
  is_method local_58;
  name in_stack_ffffffffffffffb0;
  arg_v *extra_4_00;
  arg_v *extra_5;
  arg_v *in_stack_ffffffffffffffc8;
  
  extra_4_00 = (arg_v *)*in_RDX;
  extra_5 = (arg_v *)in_RDX[1];
  obj.m_ptr = (PyObject *)
              _GraphContigger___pybind11__method_adaptor<GraphContigger,void,GraphContigger,PairedReadsDatastore_const&,int,int,int,float>_void_GraphContigger_____PairedReadsDatastore_const__int_int_int_float___
                        (extra_4_00,(offset_in_Node_to_subr)extra_5);
  default_.m_ptr = extraout_RDX;
  pybind11::name::name((name *)&stack0xffffffffffffffb0,in_RSI);
  is_method::is_method(&local_58,in_RDI);
  none::none(in_stack_ffffffffffffff30);
  getattr(obj,in_stack_ffffffffffffff38,default_);
  sibling::sibling(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  cpp_function::
  cpp_function<void,GraphContigger,PairedReadsDatastore_const&,int,int,int,float,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v>
            (local_80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (is_method *)default_.m_ptr,(sibling *)obj.m_ptr,(arg *)in_stack_ffffffffffffffb0.value
             ,extra_4_00,extra_5,in_stack_ffffffffffffffc8,in_R9);
  object::~object((object *)0x285e6c);
  none::~none((none *)0x285e76);
  pybind11::detail::add_class_method(in_RCX,in_R8,(cpp_function *)in_R9);
  cpp_function::~cpp_function((cpp_function *)0x285e9f);
  return (class_<GraphContigger> *)in_RDI;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }